

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  undefined *puVar3;
  double *pdVar4;
  int in_ESI;
  TPZVec<double> *in_RDI;
  double dVar5;
  int k;
  int j;
  int i;
  int index;
  TPZFNMatrix<20,_double> dphi2;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  TPZFNMatrix<20,_double> phi2;
  TPZFNMatrix<20,_double> phi1;
  TPZFNMatrix<20,_double> phi0;
  int ord;
  double in_stack_fffffffffffff760;
  double *in_stack_fffffffffffff768;
  TPZFNMatrix<20,_double> *in_stack_fffffffffffff770;
  int local_798;
  int local_794;
  int local_790;
  undefined1 local_788 [312];
  undefined1 local_650 [312];
  undefined1 local_518 [312];
  undefined1 local_3e0 [328];
  undefined1 local_298 [312];
  undefined1 local_160 [316];
  int local_24;
  TPZVec<double> *local_8;
  
  if (2 < in_ESI) {
    local_24 = in_ESI + -2;
    local_8 = in_RDI;
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,0);
    (*(code *)puVar3)(*pdVar4,local_24,local_160,local_518);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,1);
    (*(code *)puVar3)(*pdVar4,local_24,local_298,local_650);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,2);
    (*(code *)puVar3)(*pdVar4 + *pdVar4 + -1.0,local_24,local_3e0,local_788);
    for (local_790 = 0; local_790 < local_24; local_790 = local_790 + 1) {
      for (local_794 = 0; local_794 < local_24; local_794 = local_794 + 1) {
        for (local_798 = 0; local_798 < local_24; local_798 = local_798 + 1) {
          if (local_790 + local_794 + local_798 < local_24) {
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = dVar5 * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = dVar5 * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = dVar5 * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            in_stack_fffffffffffff770 = (TPZFNMatrix<20,_double> *)(*pdVar4 + *pdVar4);
            pdVar4 = TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_fffffffffffff770,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            in_stack_fffffffffffff760 = (double)in_stack_fffffffffffff770 * *pdVar4;
            in_stack_fffffffffffff768 =
                 TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff768,(int64_t)in_stack_fffffffffffff760);
            dVar5 = in_stack_fffffffffffff760 * *in_stack_fffffffffffff768;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = dVar5;
          }
        }
      }
    }
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1882fb9);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1882fc6);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1882fd3);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1882fe0);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1882fed);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1882ffa);
  }
  return;
}

Assistant:

void TPZShapePiram::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		// calculate the values of the function and derivatives of the product of the orthogonal functions
		if(order < 3) return;
		int ord = order-2;
		TPZFNMatrix<20, REAL> phi0(ord,1),phi1(ord,1),phi2(ord,1),
		dphi0(1,ord),dphi1(1,ord),dphi2(1,ord);
		TPZShapeLinear::fOrthogonal(x[0],ord,phi0,dphi0);//f e df            -1<=x0<=1
		TPZShapeLinear::fOrthogonal(x[1],ord,phi1,dphi1);//g e dg            -1<=x1<=1
		TPZShapeLinear::fOrthogonal(2.*x[2]-1.,ord,phi2,dphi2);//h e dh       0<=x3<=1 -> -1<=2*x2-1<=1
		int index = 0;   // integration point internal to pyramid
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					if( i+j+k < ord ) {
						//int index = ord*(ord*i+j)+k; //i,j,k � o grau das fun��es ortogonais
						phi(index,0) =    phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) =   dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =    phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) = 2.*phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}